

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

void ZopfliCostModelSetFromLiteralCosts
               (ZopfliCostModel *self,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong local_88;
  size_t i;
  size_t num_bytes;
  float *cost_cmd;
  float *cost_dist;
  float literal_carry;
  float *literal_costs;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  ZopfliCostModel *self_local;
  double local_20;
  double local_10;
  
  pfVar2 = self->literal_costs_;
  cost_dist._4_4_ = 0.0;
  pfVar3 = self->cost_dist_;
  uVar5 = self->num_bytes_;
  BrotliEstimateBitCostsForLiterals(position,uVar5,ringbuffer_mask,ringbuffer,pfVar2 + 1);
  *pfVar2 = 0.0;
  for (local_88 = 0; local_88 < uVar5; local_88 = local_88 + 1) {
    fVar1 = pfVar2[local_88 + 1];
    pfVar2[local_88 + 1] = pfVar2[local_88] + fVar1 + cost_dist._4_4_;
    cost_dist._4_4_ = (fVar1 + cost_dist._4_4_) - (pfVar2[local_88 + 1] - pfVar2[local_88]);
  }
  for (local_88 = 0; local_88 < 0x2c0; local_88 = local_88 + 1) {
    uVar4 = (int)local_88 + 0xb;
    uVar5 = CONCAT44(0,uVar4);
    if (uVar5 < 0x100) {
      local_10 = kLog2Table[uVar5];
    }
    else {
      auVar6._8_4_ = 0;
      auVar6._0_8_ = uVar5;
      auVar6._12_4_ = 0x45300000;
      local_10 = log2((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar4) - 4503599627370496.0));
    }
    self->cost_cmd_[local_88] = (float)local_10;
  }
  for (local_88 = 0; local_88 < self->distance_histogram_size; local_88 = local_88 + 1) {
    uVar4 = (int)local_88 + 0x14;
    uVar5 = CONCAT44(0,uVar4);
    if (uVar5 < 0x100) {
      local_20 = kLog2Table[uVar5];
    }
    else {
      auVar7._8_4_ = 0;
      auVar7._0_8_ = uVar5;
      auVar7._12_4_ = 0x45300000;
      local_20 = log2((auVar7._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar4) - 4503599627370496.0));
    }
    pfVar3[local_88] = (float)local_20;
  }
  self->min_cost_cmd_ = 3.4594316;
  return;
}

Assistant:

static void ZopfliCostModelSetFromLiteralCosts(ZopfliCostModel* self,
                                               size_t position,
                                               const uint8_t* ringbuffer,
                                               size_t ringbuffer_mask) {
  float* literal_costs = self->literal_costs_;
  float literal_carry = 0.0;
  float* cost_dist = self->cost_dist_;
  float* cost_cmd = self->cost_cmd_;
  size_t num_bytes = self->num_bytes_;
  size_t i;
  BrotliEstimateBitCostsForLiterals(position, num_bytes, ringbuffer_mask,
                                    ringbuffer, &literal_costs[1]);
  literal_costs[0] = 0.0;
  for (i = 0; i < num_bytes; ++i) {
    literal_carry += literal_costs[i + 1];
    literal_costs[i + 1] = literal_costs[i] + literal_carry;
    literal_carry -= literal_costs[i + 1] - literal_costs[i];
  }
  for (i = 0; i < BROTLI_NUM_COMMAND_SYMBOLS; ++i) {
    cost_cmd[i] = (float)FastLog2(11 + (uint32_t)i);
  }
  for (i = 0; i < self->distance_histogram_size; ++i) {
    cost_dist[i] = (float)FastLog2(20 + (uint32_t)i);
  }
  self->min_cost_cmd_ = (float)FastLog2(11);
}